

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O3

_Bool ssh_test_for_upstream(char *host,int port,Conf *conf)

{
  _Bool _Var1;
  int savedport;
  char *savedhost;
  int local_34;
  char *local_30;
  
  random_ref();
  ssh_hostport_setup(host,port,conf,&local_30,&local_34,(char **)0x0);
  _Var1 = ssh_share_test_for_upstream(local_30,local_34,conf);
  safefree(local_30);
  random_unref();
  return _Var1;
}

Assistant:

static bool ssh_test_for_upstream(const char *host, int port, Conf *conf)
{
    char *savedhost;
    int savedport;
    bool ret;

    random_ref(); /* platform may need this to determine share socket name */
    ssh_hostport_setup(host, port, conf, &savedhost, &savedport, NULL);
    ret = ssh_share_test_for_upstream(savedhost, savedport, conf);
    sfree(savedhost);
    random_unref();

    return ret;
}